

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O2

DVector2 __thiscall AActor::Vec2To(AActor *this,AActor *other)

{
  double dVar1;
  double dVar2;
  AActor *in_RDX;
  DVector2 DVar3;
  DVector3 local_38;
  
  PosRelative(&local_38,in_RDX,other);
  dVar1 = (other->__Pos).X;
  dVar2 = (other->__Pos).Y;
  DVar3.Y = (_func_int **)(local_38.X - dVar1);
  (this->super_DThinker).super_DObject._vptr_DObject = DVar3.Y;
  (this->super_DThinker).super_DObject.Class = (PClass *)(local_38.Y - dVar2);
  DVar3.X = dVar1;
  return DVar3;
}

Assistant:

DVector2 Vec2To(AActor *other) const
	{
		return other->PosRelative(this) - Pos();
	}